

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong uVar1;
  Geometry *this;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar41;
  float fVar42;
  undefined1 auVar37 [16];
  float fVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  undefined1 auVar51 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [8];
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  float local_fe8 [4];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  float fStack_f90;
  float fStack_f8c;
  long local_f88;
  ulong local_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  local_ff8._4_4_ = (query->p).field_0.field_0.x;
  local_1008._4_4_ = (query->p).field_0.field_0.y;
  local_1018._4_4_ = (query->p).field_0.field_0.z;
  local_fa8 = (context->query_radius).field_0.m128[0];
  fStack_fc4 = *(float *)((long)&(context->query_radius).field_0 + 4);
  fStack_fd4 = *(float *)((long)&(context->query_radius).field_0 + 8);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fStack_fb0 = 0.0;
    fStack_fb4 = 0.0;
    local_fb8 = query->radius * query->radius;
  }
  else {
    fVar17 = (context->query_radius).field_0.m128[0];
    fVar18 = (context->query_radius).field_0.m128[1];
    fStack_fb0 = (context->query_radius).field_0.m128[2];
    fStack_fb4 = (context->query_radius).field_0.m128[3];
    fStack_fb0 = fStack_fb0 * fStack_fb0;
    fStack_fb4 = fStack_fb4 * fStack_fb4;
    local_fb8 = fStack_fb0 + fVar18 * fVar18 + fVar17 * fVar17;
  }
  pauVar15 = (undefined1 (*) [16])local_f68;
  local_ff8._0_4_ = local_ff8._4_4_;
  fStack_ff0 = (float)local_ff8._4_4_;
  fStack_fec = (float)local_ff8._4_4_;
  local_1008._0_4_ = local_1008._4_4_;
  fStack_1000 = (float)local_1008._4_4_;
  fStack_ffc = (float)local_1008._4_4_;
  local_1018._0_4_ = local_1018._4_4_;
  fStack_1010 = (float)local_1018._4_4_;
  fStack_100c = (float)local_1018._4_4_;
  local_fc8 = fStack_fc4;
  fStack_fc0 = fStack_fc4;
  fStack_fbc = fStack_fc4;
  local_fd8 = fStack_fd4;
  fStack_fd0 = fStack_fd4;
  fStack_fcc = fStack_fd4;
  fVar16 = local_fa8 * local_fa8;
  bVar8 = false;
  fVar17 = fVar16;
  fVar18 = fVar16;
  fVar19 = fVar16;
  fStack_fac = fStack_fb4;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
LAB_00d09e88:
  local_f98 = CONCAT44((float)local_ff8._4_4_ - fStack_fa4,(float)local_ff8._4_4_ - local_fa8);
  fStack_f90 = (float)local_ff8._4_4_ - fStack_fa0;
  fStack_f8c = (float)local_ff8._4_4_ - fStack_f9c;
  while (pauVar6 = pauVar15 + -1, pauVar15 = pauVar15 + -1,
        *(float *)((long)*pauVar6 + 8) <= local_fb8) {
    uVar10 = *(ulong *)*pauVar15;
LAB_00d09ee9:
    uVar11 = (uint)uVar10;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar10 & 8) != 0) {
LAB_00d0a464:
        local_f88 = (ulong)(uVar11 & 0xf) - 8;
        if (local_f88 == 0) break;
        lVar12 = (uVar10 & 0xfffffffffffffff0) + 0x130;
        local_f98 = 0;
        uVar10 = 0;
        goto LAB_00d0a48a;
      }
      uVar9 = uVar10 & 0xfffffffffffffff0;
      fVar36 = query->time;
      auVar22._4_4_ = fVar36;
      auVar22._0_4_ = fVar36;
      auVar22._8_4_ = fVar36;
      auVar22._12_4_ = fVar36;
      auVar25._0_4_ = *(float *)(uVar9 + 0x80) * fVar36 + *(float *)(uVar9 + 0x20);
      auVar25._4_4_ = *(float *)(uVar9 + 0x84) * fVar36 + *(float *)(uVar9 + 0x24);
      auVar25._8_4_ = *(float *)(uVar9 + 0x88) * fVar36 + *(float *)(uVar9 + 0x28);
      auVar25._12_4_ = *(float *)(uVar9 + 0x8c) * fVar36 + *(float *)(uVar9 + 0x2c);
      auVar37._0_4_ = *(float *)(uVar9 + 0xa0) * fVar36 + *(float *)(uVar9 + 0x40);
      auVar37._4_4_ = *(float *)(uVar9 + 0xa4) * fVar36 + *(float *)(uVar9 + 0x44);
      auVar37._8_4_ = *(float *)(uVar9 + 0xa8) * fVar36 + *(float *)(uVar9 + 0x48);
      auVar37._12_4_ = *(float *)(uVar9 + 0xac) * fVar36 + *(float *)(uVar9 + 0x4c);
      auVar31._0_4_ = *(float *)(uVar9 + 0xc0) * fVar36 + *(float *)(uVar9 + 0x60);
      auVar31._4_4_ = *(float *)(uVar9 + 0xc4) * fVar36 + *(float *)(uVar9 + 100);
      auVar31._8_4_ = *(float *)(uVar9 + 200) * fVar36 + *(float *)(uVar9 + 0x68);
      auVar31._12_4_ = *(float *)(uVar9 + 0xcc) * fVar36 + *(float *)(uVar9 + 0x6c);
      auVar28._0_4_ = *(float *)(uVar9 + 0x90) * fVar36 + *(float *)(uVar9 + 0x30);
      auVar28._4_4_ = *(float *)(uVar9 + 0x94) * fVar36 + *(float *)(uVar9 + 0x34);
      auVar28._8_4_ = *(float *)(uVar9 + 0x98) * fVar36 + *(float *)(uVar9 + 0x38);
      auVar28._12_4_ = *(float *)(uVar9 + 0x9c) * fVar36 + *(float *)(uVar9 + 0x3c);
      auVar44._0_4_ = *(float *)(uVar9 + 0xb0) * fVar36 + *(float *)(uVar9 + 0x50);
      auVar44._4_4_ = *(float *)(uVar9 + 0xb4) * fVar36 + *(float *)(uVar9 + 0x54);
      auVar44._8_4_ = *(float *)(uVar9 + 0xb8) * fVar36 + *(float *)(uVar9 + 0x58);
      auVar44._12_4_ = *(float *)(uVar9 + 0xbc) * fVar36 + *(float *)(uVar9 + 0x5c);
      auVar48._0_4_ = *(float *)(uVar9 + 0xd0) * fVar36 + *(float *)(uVar9 + 0x70);
      auVar48._4_4_ = *(float *)(uVar9 + 0xd4) * fVar36 + *(float *)(uVar9 + 0x74);
      auVar48._8_4_ = *(float *)(uVar9 + 0xd8) * fVar36 + *(float *)(uVar9 + 0x78);
      auVar48._12_4_ = *(float *)(uVar9 + 0xdc) * fVar36 + *(float *)(uVar9 + 0x7c);
      auVar51 = maxps(_local_ff8,auVar25);
      auVar51 = minps(auVar51,auVar28);
      fVar50 = auVar51._0_4_ - (float)local_ff8._4_4_;
      fVar52 = auVar51._4_4_ - (float)local_ff8._4_4_;
      fVar53 = auVar51._8_4_ - (float)local_ff8._4_4_;
      fVar54 = auVar51._12_4_ - (float)local_ff8._4_4_;
      auVar51 = maxps(_local_1008,auVar37);
      auVar51 = minps(auVar51,auVar44);
      fVar55 = auVar51._0_4_ - (float)local_1008._4_4_;
      fVar56 = auVar51._4_4_ - (float)local_1008._4_4_;
      fVar57 = auVar51._8_4_ - (float)local_1008._4_4_;
      fVar58 = auVar51._12_4_ - (float)local_1008._4_4_;
      auVar51 = maxps(_local_1018,auVar31);
      auVar51 = minps(auVar51,auVar48);
      fVar36 = auVar51._0_4_ - (float)local_1018._4_4_;
      fVar41 = auVar51._4_4_ - (float)local_1018._4_4_;
      fVar42 = auVar51._8_4_ - (float)local_1018._4_4_;
      fVar43 = auVar51._12_4_ - (float)local_1018._4_4_;
      local_fe8[0] = fVar36 * fVar36 + fVar55 * fVar55 + fVar50 * fVar50;
      local_fe8[1] = fVar41 * fVar41 + fVar56 * fVar56 + fVar52 * fVar52;
      local_fe8[2] = fVar42 * fVar42 + fVar57 * fVar57 + fVar53 * fVar53;
      local_fe8[3] = fVar43 * fVar43 + fVar58 * fVar58 + fVar54 * fVar54;
      auVar35._0_4_ = -(uint)(auVar25._0_4_ <= auVar28._0_4_ && local_fe8[0] <= fVar16);
      auVar35._4_4_ = -(uint)(auVar25._4_4_ <= auVar28._4_4_ && local_fe8[1] <= fVar17);
      auVar35._8_4_ = -(uint)(auVar25._8_4_ <= auVar28._8_4_ && local_fe8[2] <= fVar18);
      auVar35._12_4_ = -(uint)(auVar25._12_4_ <= auVar28._12_4_ && local_fe8[3] <= fVar19);
      if ((uVar11 & 7) != 6) goto LAB_00d09fea;
LAB_00d0a166:
      uVar9 = uVar10 & 0xfffffffffffffff0;
      auVar20._0_4_ =
           (-(uint)(auVar22._0_4_ < *(float *)(uVar9 + 0xf0) &&
                   *(float *)(uVar9 + 0xe0) <= auVar22._0_4_) & auVar35._0_4_) << 0x1f;
      auVar20._4_4_ =
           (-(uint)(auVar22._4_4_ < *(float *)(uVar9 + 0xf4) &&
                   *(float *)(uVar9 + 0xe4) <= auVar22._4_4_) & auVar35._4_4_) << 0x1f;
      auVar20._8_4_ =
           (-(uint)(auVar22._8_4_ < *(float *)(uVar9 + 0xf8) &&
                   *(float *)(uVar9 + 0xe8) <= auVar22._8_4_) & auVar35._8_4_) << 0x1f;
      auVar20._12_4_ =
           (-(uint)(auVar22._12_4_ < *(float *)(uVar9 + 0xfc) &&
                   *(float *)(uVar9 + 0xec) <= auVar22._12_4_) & auVar35._12_4_) << 0x1f;
      uVar11 = movmskps(uVar11 & 7,auVar20);
    }
    else {
      if ((uVar10 & 8) != 0) goto LAB_00d0a464;
      uVar9 = uVar10 & 0xfffffffffffffff0;
      fVar36 = query->time;
      auVar22._4_4_ = fVar36;
      auVar22._0_4_ = fVar36;
      auVar22._8_4_ = fVar36;
      auVar22._12_4_ = fVar36;
      auVar47._0_4_ = *(float *)(uVar9 + 0x80) * fVar36 + *(float *)(uVar9 + 0x20);
      auVar47._4_4_ = *(float *)(uVar9 + 0x84) * fVar36 + *(float *)(uVar9 + 0x24);
      auVar47._8_4_ = *(float *)(uVar9 + 0x88) * fVar36 + *(float *)(uVar9 + 0x28);
      auVar47._12_4_ = *(float *)(uVar9 + 0x8c) * fVar36 + *(float *)(uVar9 + 0x2c);
      auVar40._0_4_ = *(float *)(uVar9 + 0xa0) * fVar36 + *(float *)(uVar9 + 0x40);
      auVar40._4_4_ = *(float *)(uVar9 + 0xa4) * fVar36 + *(float *)(uVar9 + 0x44);
      auVar40._8_4_ = *(float *)(uVar9 + 0xa8) * fVar36 + *(float *)(uVar9 + 0x48);
      auVar40._12_4_ = *(float *)(uVar9 + 0xac) * fVar36 + *(float *)(uVar9 + 0x4c);
      auVar51._0_4_ = *(float *)(uVar9 + 0xc0) * fVar36 + *(float *)(uVar9 + 0x60);
      auVar51._4_4_ = *(float *)(uVar9 + 0xc4) * fVar36 + *(float *)(uVar9 + 100);
      auVar51._8_4_ = *(float *)(uVar9 + 200) * fVar36 + *(float *)(uVar9 + 0x68);
      auVar51._12_4_ = *(float *)(uVar9 + 0xcc) * fVar36 + *(float *)(uVar9 + 0x6c);
      auVar38._0_4_ = *(float *)(uVar9 + 0x90) * fVar36 + *(float *)(uVar9 + 0x30);
      auVar38._4_4_ = *(float *)(uVar9 + 0x94) * fVar36 + *(float *)(uVar9 + 0x34);
      auVar38._8_4_ = *(float *)(uVar9 + 0x98) * fVar36 + *(float *)(uVar9 + 0x38);
      auVar38._12_4_ = *(float *)(uVar9 + 0x9c) * fVar36 + *(float *)(uVar9 + 0x3c);
      auVar49._0_4_ = *(float *)(uVar9 + 0xb0) * fVar36 + *(float *)(uVar9 + 0x50);
      auVar49._4_4_ = *(float *)(uVar9 + 0xb4) * fVar36 + *(float *)(uVar9 + 0x54);
      auVar49._8_4_ = *(float *)(uVar9 + 0xb8) * fVar36 + *(float *)(uVar9 + 0x58);
      auVar49._12_4_ = *(float *)(uVar9 + 0xbc) * fVar36 + *(float *)(uVar9 + 0x5c);
      auVar45._0_4_ = *(float *)(uVar9 + 0xd0) * fVar36 + *(float *)(uVar9 + 0x70);
      auVar45._4_4_ = *(float *)(uVar9 + 0xd4) * fVar36 + *(float *)(uVar9 + 0x74);
      auVar45._8_4_ = *(float *)(uVar9 + 0xd8) * fVar36 + *(float *)(uVar9 + 0x78);
      auVar45._12_4_ = *(float *)(uVar9 + 0xdc) * fVar36 + *(float *)(uVar9 + 0x7c);
      auVar35 = maxps(_local_ff8,auVar47);
      auVar35 = minps(auVar35,auVar38);
      fVar36 = auVar35._0_4_ - (float)local_ff8._4_4_;
      fVar42 = auVar35._4_4_ - (float)local_ff8._4_4_;
      fVar50 = auVar35._8_4_ - (float)local_ff8._4_4_;
      fVar53 = auVar35._12_4_ - (float)local_ff8._4_4_;
      auVar35 = maxps(_local_1008,auVar40);
      auVar35 = minps(auVar35,auVar49);
      fVar55 = auVar35._0_4_ - (float)local_1008._4_4_;
      fVar56 = auVar35._4_4_ - (float)local_1008._4_4_;
      fVar57 = auVar35._8_4_ - (float)local_1008._4_4_;
      fVar58 = auVar35._12_4_ - (float)local_1008._4_4_;
      auVar35 = maxps(_local_1018,auVar51);
      auVar35 = minps(auVar35,auVar45);
      fVar41 = auVar35._0_4_ - (float)local_1018._4_4_;
      fVar43 = auVar35._4_4_ - (float)local_1018._4_4_;
      fVar52 = auVar35._8_4_ - (float)local_1018._4_4_;
      fVar54 = auVar35._12_4_ - (float)local_1018._4_4_;
      local_fe8[0] = fVar41 * fVar41 + fVar55 * fVar55 + fVar36 * fVar36;
      local_fe8[1] = fVar43 * fVar43 + fVar56 * fVar56 + fVar42 * fVar42;
      local_fe8[2] = fVar52 * fVar52 + fVar57 * fVar57 + fVar50 * fVar50;
      local_fe8[3] = fVar54 * fVar54 + fVar58 * fVar58 + fVar53 * fVar53;
      uVar4 = (uint)(((auVar51._0_4_ <= (float)local_1018._4_4_ + local_fd8 &&
                      (float)local_ff8._4_4_ - local_fa8 <= auVar38._0_4_) &&
                     (auVar40._0_4_ <= (float)local_1008._4_4_ + local_fc8 &&
                     auVar47._0_4_ <= (float)local_ff8._4_4_ + local_fa8)) &&
                    ((float)local_1018._4_4_ - local_fd8 <= auVar45._0_4_ &&
                    ((float)local_1008._4_4_ - local_fc8 <= auVar49._0_4_ &&
                    auVar47._0_4_ <= auVar38._0_4_)));
      auVar35._0_4_ = -uVar4;
      uVar5 = (uint)(((auVar51._4_4_ <= (float)local_1018._4_4_ + fStack_fd4 &&
                      (float)local_ff8._4_4_ - fStack_fa4 <= auVar38._4_4_) &&
                     (auVar40._4_4_ <= (float)local_1008._4_4_ + fStack_fc4 &&
                     auVar47._4_4_ <= (float)local_ff8._4_4_ + fStack_fa4)) &&
                    ((float)local_1018._4_4_ - fStack_fd4 <= auVar45._4_4_ &&
                    ((float)local_1008._4_4_ - fStack_fc4 <= auVar49._4_4_ &&
                    auVar47._4_4_ <= auVar38._4_4_)));
      auVar35._4_4_ = -uVar5;
      uVar3 = (uint)(((auVar51._8_4_ <= (float)local_1018._4_4_ + fStack_fd0 &&
                      (float)local_ff8._4_4_ - fStack_fa0 <= auVar38._8_4_) &&
                     (auVar40._8_4_ <= (float)local_1008._4_4_ + fStack_fc0 &&
                     auVar47._8_4_ <= (float)local_ff8._4_4_ + fStack_fa0)) &&
                    ((float)local_1018._4_4_ - fStack_fd0 <= auVar45._8_4_ &&
                    ((float)local_1008._4_4_ - fStack_fc0 <= auVar49._8_4_ &&
                    auVar47._8_4_ <= auVar38._8_4_)));
      auVar35._8_4_ = -uVar3;
      uVar2 = (uint)(((auVar51._12_4_ <= (float)local_1018._4_4_ + fStack_fcc &&
                      (float)local_ff8._4_4_ - fStack_f9c <= auVar38._12_4_) &&
                     (auVar40._12_4_ <= (float)local_1008._4_4_ + fStack_fbc &&
                     auVar47._12_4_ <= (float)local_ff8._4_4_ + fStack_f9c)) &&
                    ((float)local_1018._4_4_ - fStack_fcc <= auVar45._12_4_ &&
                    ((float)local_1008._4_4_ - fStack_fbc <= auVar49._12_4_ &&
                    auVar47._12_4_ <= auVar38._12_4_)));
      auVar35._12_4_ = -uVar2;
      if ((uVar11 & 7) == 6) goto LAB_00d0a166;
      auVar35._0_4_ = uVar4 * -0x80000000;
      auVar35._4_4_ = uVar5 * -0x80000000;
      auVar35._8_4_ = uVar3 * -0x80000000;
      auVar35._12_4_ = uVar2 * -0x80000000;
LAB_00d09fea:
      uVar11 = movmskps(uVar11 & 7,auVar35);
    }
    if (uVar11 != 0) {
      uVar9 = uVar10 & 0xfffffffffffffff0;
      lVar12 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      uVar10 = *(ulong *)(uVar9 + lVar12 * 8);
      uVar11 = uVar11 - 1 & uVar11;
      if (uVar11 != 0) {
        fVar36 = local_fe8[lVar12];
        lVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar1 = *(ulong *)(uVar9 + lVar12 * 8);
        fVar41 = local_fe8[lVar12];
        uVar11 = uVar11 - 1 & uVar11;
        if (uVar11 == 0) {
          if ((uint)fVar36 < (uint)fVar41) {
            *(ulong *)*pauVar15 = uVar1;
            *(float *)((long)*pauVar15 + 8) = fVar41;
            pauVar15 = pauVar15 + 1;
          }
          else {
            *(ulong *)*pauVar15 = uVar10;
            *(float *)((long)*pauVar15 + 8) = fVar36;
            uVar10 = uVar1;
            pauVar15 = pauVar15 + 1;
          }
        }
        else {
          auVar21._8_4_ = fVar36;
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = 0;
          auVar26._8_4_ = fVar41;
          auVar26._0_8_ = uVar1;
          auVar26._12_4_ = 0;
          lVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar9 + lVar12 * 8);
          fVar42 = local_fe8[lVar12];
          auVar29._8_4_ = fVar42;
          auVar29._0_8_ = uVar10;
          auVar29._12_4_ = 0;
          auVar32._8_4_ = -(uint)((int)fVar36 < (int)fVar41);
          uVar11 = uVar11 - 1 & uVar11;
          if (uVar11 == 0) {
            auVar32._4_4_ = auVar32._8_4_;
            auVar32._0_4_ = auVar32._8_4_;
            auVar32._12_4_ = auVar32._8_4_;
            auVar22 = auVar21 & auVar32 | ~auVar32 & auVar26;
            auVar51 = auVar26 & auVar32 | ~auVar32 & auVar21;
            auVar33._8_4_ = -(uint)(auVar22._8_4_ < (int)fVar42);
            auVar33._0_8_ = CONCAT44(auVar33._8_4_,auVar33._8_4_);
            auVar33._12_4_ = auVar33._8_4_;
            uVar10 = ~auVar33._0_8_ & uVar10 | auVar22._0_8_ & auVar33._0_8_;
            auVar22 = auVar29 & auVar33 | ~auVar33 & auVar22;
            auVar23._8_4_ = -(uint)(auVar51._8_4_ < auVar22._8_4_);
            auVar23._4_4_ = auVar23._8_4_;
            auVar23._0_4_ = auVar23._8_4_;
            auVar23._12_4_ = auVar23._8_4_;
            *pauVar15 = ~auVar23 & auVar51 | auVar22 & auVar23;
            pauVar15[1] = auVar51 & auVar23 | ~auVar23 & auVar22;
            pauVar15 = pauVar15 + 2;
          }
          else {
            lVar12 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            fVar36 = local_fe8[lVar12];
            auVar39._8_4_ = fVar36;
            auVar39._0_8_ = *(undefined8 *)(uVar9 + lVar12 * 8);
            auVar39._12_4_ = 0;
            auVar34._4_4_ = auVar32._8_4_;
            auVar34._0_4_ = auVar32._8_4_;
            auVar34._8_4_ = auVar32._8_4_;
            auVar34._12_4_ = auVar32._8_4_;
            auVar22 = auVar21 & auVar34 | ~auVar34 & auVar26;
            auVar51 = auVar26 & auVar34 | ~auVar34 & auVar21;
            auVar46._0_4_ = -(uint)((int)fVar42 < (int)fVar36);
            auVar46._4_4_ = -(uint)((int)fVar42 < (int)fVar36);
            auVar46._8_4_ = -(uint)((int)fVar42 < (int)fVar36);
            auVar46._12_4_ = -(uint)((int)fVar42 < (int)fVar36);
            auVar35 = auVar29 & auVar46 | ~auVar46 & auVar39;
            auVar47 = ~auVar46 & auVar29 | auVar39 & auVar46;
            auVar30._8_4_ = -(uint)(auVar51._8_4_ < auVar47._8_4_);
            auVar30._4_4_ = auVar30._8_4_;
            auVar30._0_4_ = auVar30._8_4_;
            auVar30._12_4_ = auVar30._8_4_;
            auVar40 = auVar51 & auVar30 | ~auVar30 & auVar47;
            auVar27._8_4_ = -(uint)(auVar22._8_4_ < auVar35._8_4_);
            auVar27._0_8_ = CONCAT44(auVar27._8_4_,auVar27._8_4_);
            auVar27._12_4_ = auVar27._8_4_;
            uVar10 = auVar22._0_8_ & auVar27._0_8_ | ~auVar27._0_8_ & auVar35._0_8_;
            auVar22 = ~auVar27 & auVar22 | auVar35 & auVar27;
            auVar24._8_4_ = -(uint)(auVar22._8_4_ < auVar40._8_4_);
            auVar24._4_4_ = auVar24._8_4_;
            auVar24._0_4_ = auVar24._8_4_;
            auVar24._12_4_ = auVar24._8_4_;
            *pauVar15 = ~auVar30 & auVar51 | auVar47 & auVar30;
            pauVar15[1] = ~auVar24 & auVar22 | auVar40 & auVar24;
            pauVar15[2] = auVar22 & auVar24 | ~auVar24 & auVar40;
            pauVar15 = pauVar15 + 3;
          }
        }
      }
      goto LAB_00d09ee9;
    }
    if (pauVar15 == (undefined1 (*) [16])&local_f78) {
      return bVar8;
    }
  }
  goto LAB_00d0a589;
LAB_00d0a48a:
  do {
    local_f80 = uVar10;
    lVar14 = -4;
    bVar13 = 0;
    do {
      uVar11 = *(uint *)(lVar12 + lVar14 * 4);
      if ((ulong)uVar11 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar11].ptr;
      context->geomID = uVar11;
      context->primID = *(uint *)(lVar12 + 0x10 + lVar14 * 4);
      bVar7 = Geometry::pointQuery(this,query,context);
      bVar13 = bVar13 | bVar7;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
    uVar10 = CONCAT71((int7)(local_f80 >> 8),(byte)local_f80 | bVar13);
    local_f98 = local_f98 + 1;
    lVar12 = lVar12 + 0x140;
  } while (local_f98 != local_f88);
  if ((local_f80 & 1) != 0 || bVar13 != 0) {
    local_fa8 = (context->query_radius).field_0.m128[0];
    fStack_fc4 = (context->query_radius).field_0.m128[1];
    fStack_fd4 = (context->query_radius).field_0.m128[2];
    fStack_fb4 = (context->query_radius).field_0.m128[3];
    local_fc8 = fStack_fc4;
    fStack_fc0 = fStack_fc4;
    fStack_fbc = fStack_fc4;
    local_fd8 = fStack_fd4;
    fStack_fd0 = fStack_fd4;
    fStack_fcc = fStack_fd4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fStack_fb0 = 0.0;
      fStack_fb4 = 0.0;
      local_fb8 = query->radius * query->radius;
    }
    else {
      fStack_fb0 = fStack_fd4 * fStack_fd4;
      fStack_fb4 = fStack_fb4 * fStack_fb4;
      local_fb8 = fStack_fb0 + fStack_fc4 * fStack_fc4 + local_fa8 * local_fa8;
    }
    bVar8 = true;
    fStack_fac = fStack_fb4;
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
  }
LAB_00d0a589:
  fVar16 = local_fa8 * local_fa8;
  fVar17 = fStack_fa4 * fStack_fa4;
  fVar18 = fStack_fa0 * fStack_fa0;
  fVar19 = fStack_f9c * fStack_f9c;
  if (pauVar15 == (undefined1 (*) [16])&local_f78) {
    return bVar8;
  }
  goto LAB_00d09e88;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }